

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_traits.hpp
# Opt level: O0

void jsoncons::encode_traits<std::pair<int,encode_traits_tests::book>,wchar_t,void>::
     encode<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>>
               (value_type *val,basic_json_visitor<wchar_t> *encoder,
               basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *proto,
               error_code *ec)

{
  bool bVar1;
  error_code *in_RCX;
  book *in_RSI;
  error_code *in_stack_ffffffffffffff98;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *in_stack_ffffffffffffffa0;
  basic_json_visitor<wchar_t> *in_stack_ffffffffffffffa8;
  book *val_00;
  ser_context local_40;
  error_code *in_stack_ffffffffffffffc8;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *in_stack_ffffffffffffffd0;
  ser_context encoder_00;
  
  encoder_00._vptr_ser_context = (_func_int **)0x0;
  val_00 = in_RSI;
  ser_context::ser_context((ser_context *)&stack0xffffffffffffffd8);
  basic_json_visitor<wchar_t>::begin_array
            ((basic_json_visitor<wchar_t> *)val_00,(size_t)in_stack_ffffffffffffffa8,
             (semantic_tag)((ulong)in_stack_ffffffffffffffa0 >> 0x38),
             (ser_context *)in_stack_ffffffffffffff98,(error_code *)0xa19b85);
  ser_context::~ser_context((ser_context *)&stack0xffffffffffffffd8);
  bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
  if (!bVar1) {
    encode_traits<int,wchar_t,void>::
    encode<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>>
              (&in_RCX->_M_value,(basic_json_visitor<wchar_t> *)encoder_00._vptr_ser_context,
               in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
    if (!bVar1) {
      encode_traits<encode_traits_tests::book,wchar_t,void>::
      encode<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>>
                (val_00,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98);
      bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
      if (!bVar1) {
        local_40._vptr_ser_context = (_func_int **)0x0;
        ser_context::ser_context(&local_40);
        basic_json_visitor<wchar_t>::end_array
                  ((basic_json_visitor<wchar_t> *)in_RSI,(ser_context *)in_stack_ffffffffffffff98,
                   (error_code *)0xa19c5f);
        ser_context::~ser_context(&local_40);
      }
    }
  }
  return;
}

Assistant:

static void encode(const value_type& val, 
                           basic_json_visitor<CharT>& encoder, 
                           const Json& proto, 
                           std::error_code& ec)
        {
            encoder.begin_array(2,semantic_tag::none,ser_context(),ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            encode_traits<T1,CharT>::encode(val.first, encoder, proto, ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            encode_traits<T2,CharT>::encode(val.second, encoder, proto, ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            encoder.end_array(ser_context(),ec);
        }